

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<QString,_QMakeLocalFileName>::emplaceValue<QMakeLocalFileName>
          (Node<QString,_QMakeLocalFileName> *this,QMakeLocalFileName *args)

{
  long in_FS_OFFSET;
  QMakeLocalFileName QStack_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QMakeLocalFileName::QMakeLocalFileName(&QStack_48,args);
  QMakeLocalFileName::operator=(&this->value,&QStack_48);
  QMakeLocalFileName::~QMakeLocalFileName(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }